

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.h
# Opt level: O0

void capnp::_::expectPrimitiveEq<capnp::Text::Reader>(Reader a,Reader b)

{
  bool bVar1;
  bool local_59;
  DebugExpression<capnp::Text::Reader_&> DStack_58;
  bool _kj_shouldLog;
  undefined1 local_50 [8];
  DebugComparison<capnp::Text::Reader_&,_capnp::Text::Reader_&> _kjCondition;
  Reader b_local;
  Reader a_local;
  
  b_local.super_StringPtr.content.size_ = a.super_StringPtr.content.ptr;
  b_local.super_StringPtr.content.ptr = b.super_StringPtr.content.size_;
  _kjCondition._32_8_ = b.super_StringPtr.content.ptr;
  DStack_58 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                         (Reader *)&b_local.super_StringPtr.content.size_);
  kj::_::DebugExpression<capnp::Text::Reader&>::operator==
            ((DebugComparison<capnp::Text::Reader_&,_capnp::Text::Reader_&> *)local_50,
             (DebugExpression<capnp::Text::Reader&> *)&stack0xffffffffffffffa8,
             (Reader *)&_kjCondition.result);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_50);
  if (!bVar1) {
    local_59 = kj::_::Debug::shouldLog(ERROR);
    while (local_59 != false) {
      kj::_::Debug::
      log<char_const(&)[28],kj::_::DebugComparison<capnp::Text::Reader&,capnp::Text::Reader&>&,capnp::Text::Reader&,capnp::Text::Reader&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.h"
                 ,0x9c,ERROR,"\"failed: expected \" \"(a) == (b)\", _kjCondition, a, b",
                 (char (*) [28])"failed: expected (a) == (b)",
                 (DebugComparison<capnp::Text::Reader_&,_capnp::Text::Reader_&> *)local_50,
                 (Reader *)&b_local.super_StringPtr.content.size_,(Reader *)&_kjCondition.result);
      local_59 = false;
    }
  }
  return;
}

Assistant:

void expectPrimitiveEq(T a, T b) { EXPECT_EQ(a, b); }